

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithLogTestImplicitGeneratedOutOfDate2::Run(BuildWithLogTestImplicitGeneratedOutOfDate2 *this)

{
  State *state;
  VirtualFileSystem *this_00;
  int *piVar1;
  Builder *this_01;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule touch-implicit-dep-out\n  command = touch $test_dependency ; sleep 1 ; touch $out\n  generator = 1\nbuild out.imp: touch-implicit-dep-out | inimp inimp2\n  test_dependency = inimp\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"inimp",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out.imp",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"inimp2",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    pTVar3 = g_current_test;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.imp",&local_72);
    this_01 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
    pNVar5 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d4,"builder_.AddTarget(\"out.imp\", &err)");
    std::__cxx11::string::~string((string *)&local_70);
    pTVar3 = g_current_test;
    bVar4 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar3,!bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d5,"builder_.AlreadyUpToDate()");
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_50);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d7,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d8,"builder_.AlreadyUpToDate()");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_);
    State::Reset(state);
    Builder::Cleanup(this_01);
    Plan::Reset(&(this->super_BuildWithLogTest).super_BuildTest.builder_.plan_);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.imp",&local_72);
    pNVar5 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5df,"builder_.AddTarget(\"out.imp\", &err)");
    std::__cxx11::string::~string((string *)&local_70);
    pTVar3 = g_current_test;
    bVar4 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5e0,"builder_.AlreadyUpToDate()");
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.imp",&local_72);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
    testing::Test::Check
              (pTVar3,(bool)(pNVar5->dirty_ ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5e1,"GetNode(\"out.imp\")->dirty()");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, ImplicitGeneratedOutOfDate2) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch-implicit-dep-out\n"
"  command = touch $test_dependency ; sleep 1 ; touch $out\n"
"  generator = 1\n"
"build out.imp: touch-implicit-dep-out | inimp inimp2\n"
"  test_dependency = inimp\n"));
  fs_.Create("inimp", "");
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("inimp2", "");
  fs_.Tick();

  string err;

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());
  EXPECT_FALSE(GetNode("out.imp")->dirty());
}